

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

void __thiscall MyGame::Example::AnyUnion::Reset(AnyUnion *this)

{
  Any AVar1;
  MonsterT *this_00;
  MonsterT *ptr_2;
  TestSimpleTableWithEnumT *ptr_1;
  MonsterT *ptr;
  AnyUnion *this_local;
  
  AVar1 = this->type;
  if (AVar1 == Any_Monster) {
    this_00 = (MonsterT *)this->value;
    if (this_00 != (MonsterT *)0x0) {
      MonsterT::~MonsterT(this_00);
      operator_delete(this_00,800);
    }
  }
  else if (AVar1 == Any_TestSimpleTableWithEnum) {
    if (this->value != (void *)0x0) {
      operator_delete(this->value,1);
    }
  }
  else if ((AVar1 == Any_MAX) && (this->value != (void *)0x0)) {
    operator_delete(this->value,1);
  }
  this->value = (void *)0x0;
  this->type = Any_MIN;
  return;
}

Assistant:

inline void AnyUnion::Reset() {
  switch (type) {
    case Any_Monster: {
      auto ptr = reinterpret_cast<MyGame::Example::MonsterT *>(value);
      delete ptr;
      break;
    }
    case Any_TestSimpleTableWithEnum: {
      auto ptr = reinterpret_cast<MyGame::Example::TestSimpleTableWithEnumT *>(value);
      delete ptr;
      break;
    }
    case Any_MyGame_Example2_Monster: {
      auto ptr = reinterpret_cast<MyGame::Example2::MonsterT *>(value);
      delete ptr;
      break;
    }
    default: break;
  }
  value = nullptr;
  type = Any_NONE;
}